

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.cpp
# Opt level: O0

CompileFlag __thiscall
hypermind::ASTBlock::compile(ASTBlock *this,Compiler *compiler,CompileFlag flag)

{
  bool bVar1;
  __shared_ptr_access<hypermind::ASTNode,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_00;
  element_type *peVar2;
  shared_ptr<hypermind::ASTNode> *stmt;
  iterator __end1;
  iterator __begin1;
  vector<std::shared_ptr<hypermind::ASTNode>,_std::allocator<std::shared_ptr<hypermind::ASTNode>_>_>
  *__range1;
  CompileFlag flag_local;
  Compiler *compiler_local;
  ASTBlock *this_local;
  
  if (flag == Check) {
    this_local._4_4_ = Error;
  }
  else {
    compiler->mCurCompileUnit->mLine = (this->super_ASTNode).line;
    compiler->mCurCompileUnit->mColumn = (this->super_ASTNode).column;
    __end1 = std::
             vector<std::shared_ptr<hypermind::ASTNode>,_std::allocator<std::shared_ptr<hypermind::ASTNode>_>_>
             ::begin(&this->stmts);
    stmt = (shared_ptr<hypermind::ASTNode> *)
           std::
           vector<std::shared_ptr<hypermind::ASTNode>,_std::allocator<std::shared_ptr<hypermind::ASTNode>_>_>
           ::end(&this->stmts);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end1,(__normal_iterator<std::shared_ptr<hypermind::ASTNode>_*,_std::vector<std::shared_ptr<hypermind::ASTNode>,_std::allocator<std::shared_ptr<hypermind::ASTNode>_>_>_>
                                  *)&stmt);
      if (!bVar1) break;
      this_00 = (__shared_ptr_access<hypermind::ASTNode,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                )__gnu_cxx::
                 __normal_iterator<std::shared_ptr<hypermind::ASTNode>_*,_std::vector<std::shared_ptr<hypermind::ASTNode>,_std::allocator<std::shared_ptr<hypermind::ASTNode>_>_>_>
                 ::operator*(&__end1);
      peVar2 = std::
               __shared_ptr_access<hypermind::ASTNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->(this_00);
      (*peVar2->_vptr_ASTNode[1])(peVar2,compiler,0);
      __gnu_cxx::
      __normal_iterator<std::shared_ptr<hypermind::ASTNode>_*,_std::vector<std::shared_ptr<hypermind::ASTNode>,_std::allocator<std::shared_ptr<hypermind::ASTNode>_>_>_>
      ::operator++(&__end1);
    }
    this_local._4_4_ = Null;
  }
  return this_local._4_4_;
}

Assistant:

AST_COMPILE(ASTBlock) {
        AST_ENTER();
        for (auto &stmt : stmts)
            stmt->compile(compiler);
        AST_LEAVE();
    }